

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall BinHash<IPAsKey>::Clear(BinHash<IPAsKey> *this)

{
  IPAsKey *pIVar1;
  IPAsKey *x;
  uint32_t i;
  BinHash<IPAsKey> *this_local;
  
  if (this->hashBin != (IPAsKey **)0x0) {
    for (x._4_4_ = 0; x._4_4_ < this->tableSize; x._4_4_ = x._4_4_ + 1) {
      while (this->hashBin[x._4_4_] != (IPAsKey *)0x0) {
        pIVar1 = this->hashBin[x._4_4_];
        this->hashBin[x._4_4_] = pIVar1->HashNext;
        if (pIVar1 != (IPAsKey *)0x0) {
          (*pIVar1->_vptr_IPAsKey[1])();
        }
      }
    }
    if (this->hashBin != (IPAsKey **)0x0) {
      operator_delete__(this->hashBin);
    }
    this->hashBin = (IPAsKey **)0x0;
  }
  this->tableCount = 0;
  this->tableSize = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }